

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassesAndEnums
          (Generator *this,GeneratorOptions *options,Printer *printer,FileDescriptor *file)

{
  long lVar1;
  Generator *this_00;
  long lVar2;
  
  this_00 = this;
  if (0 < *(int *)(file + 0x58)) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      this_00 = this;
      GenerateClass(this,options,printer,(Descriptor *)(*(long *)(file + 0x60) + lVar2));
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0xa8;
    } while (lVar1 < *(int *)(file + 0x58));
  }
  if (0 < *(int *)(file + 0x68)) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      GenerateEnum(this_00,options,printer,(EnumDescriptor *)(*(long *)(file + 0x70) + lVar1));
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x38;
    } while (lVar2 < *(int *)(file + 0x68));
  }
  return;
}

Assistant:

void Generator::GenerateClassesAndEnums(const GeneratorOptions& options,
                                        io::Printer* printer,
                                        const FileDescriptor* file) const {
  for (int i = 0; i < file->message_type_count(); i++) {
    GenerateClass(options, printer, file->message_type(i));
  }
  for (int i = 0; i < file->enum_type_count(); i++) {
    GenerateEnum(options, printer, file->enum_type(i));
  }
}